

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.cpp
# Opt level: O1

date_t duckdb::AddOperator::Operation<duckdb::date_t,int,duckdb::date_t>(date_t left,int32_t right)

{
  bool bVar1;
  OutOfRangeException *this;
  ulong uVar2;
  string local_40;
  
  uVar2 = (ulong)(uint)left.days;
  bVar1 = true;
  if ((left.days != -0x7fffffff) && (left.days != 0x7fffffff)) {
    uVar2 = (long)right + (long)left.days;
    if ((long)(int32_t)uVar2 == uVar2) {
      bVar1 = Value::IsFinite<duckdb::date_t>((date_t)(int32_t)uVar2);
    }
    else {
      bVar1 = false;
    }
  }
  if (bVar1 != false) {
    return (date_t)(int32_t)uVar2;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Date out of range","");
  OutOfRangeException::OutOfRangeException(this,&local_40);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

date_t AddOperator::Operation(date_t left, int32_t right) {
	date_t result;
	if (!TryAddOperator::Operation(left, right, result)) {
		throw OutOfRangeException("Date out of range");
	}
	return result;
}